

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  int status_value;
  allocator<char> local_119;
  int local_118 [2];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    do {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x2c,local_118,0);
      if (_Var1 != -1) goto LAB_0012cdbc;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    this = (ForkingDeathTest *)&local_30;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,"CHECK failed: File ",&local_119);
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jdalt[P]nan-plus-unit-tests/external/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_d0,&local_f0,", line ");
    local_118[1] = 0x331;
    StreamableToString<int>(&local_110,local_118 + 1);
    std::operator+(&local_b0,&local_d0,&local_110);
    std::operator+(&local_90,&local_b0,": ");
    std::operator+(&local_70,&local_90,"waitpid(child_pid_, &status_value, 0)");
    std::operator+(&local_50,&local_70," != -1");
    DeathTestAbort(&local_50);
LAB_0012cdbc:
    *(int *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
                    field_2 + 0xc) = local_118[0];
    iVar2 = local_118[0];
  }
  return iVar2;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}